

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_32bit_z1_64xN_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,int upsample_above,int dx)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  short sVar11;
  short sVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  uint uVar17;
  int iVar18;
  int iVar19;
  undefined8 *puVar20;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  uint in_R9D;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int mdif;
  int j;
  __m128i a1_1_128;
  __m128i a1_128;
  __m128i a0_1_128;
  __m128i a0_128;
  __m256i shift;
  int i;
  int base;
  __m256i res1;
  __m256i res [2];
  __m256i b;
  int r;
  int x;
  __m256i mask256;
  __m256i base_inc256;
  __m256i max_base_x256;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i a16;
  __m256i a32;
  __m256i a1_1;
  __m256i a1;
  __m256i a0_1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int local_ba4;
  int local_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_ae0 [16];
  int local_a88;
  uint local_a84;
  ushort local_910;
  undefined8 *local_8f0;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_170;
  undefined8 uStack_168;
  
  uVar17 = in_EDI + 0x3f;
  auVar2 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar2 = vpinsrd_avx(auVar2,0x10,2);
  auVar2 = vpinsrd_avx(auVar2,0x10,3);
  auVar3 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar3 = vpinsrd_avx(auVar3,0x10,2);
  auVar3 = vpinsrd_avx(auVar3,0x10,3);
  uStack_590 = auVar3._0_8_;
  uStack_588 = auVar3._8_8_;
  uVar1 = *(ushort *)(in_RCX + (long)(int)uVar17 * 2);
  auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
  auVar5 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar1,2);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar1,3);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar1,4);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar1,5);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar1,6);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar1,7);
  local_720 = auVar3._0_8_;
  uStack_718 = auVar3._8_8_;
  uStack_710 = auVar5._0_8_;
  uStack_708 = auVar5._8_8_;
  local_910 = (ushort)uVar17;
  auVar5 = vpinsrw_avx(ZEXT216(local_910),uVar17 & 0xffff,1);
  auVar5 = vpinsrw_avx(auVar5,uVar17 & 0xffff,2);
  auVar5 = vpinsrw_avx(auVar5,uVar17 & 0xffff,3);
  auVar5 = vpinsrw_avx(auVar5,uVar17 & 0xffff,4);
  auVar5 = vpinsrw_avx(auVar5,uVar17 & 0xffff,5);
  auVar5 = vpinsrw_avx(auVar5,uVar17 & 0xffff,6);
  auVar5 = vpinsrw_avx(auVar5,uVar17 & 0xffff,7);
  auVar6 = vpinsrw_avx(ZEXT216(local_910),uVar17 & 0xffff,1);
  auVar6 = vpinsrw_avx(auVar6,uVar17 & 0xffff,2);
  auVar6 = vpinsrw_avx(auVar6,uVar17 & 0xffff,3);
  auVar6 = vpinsrw_avx(auVar6,uVar17 & 0xffff,4);
  auVar6 = vpinsrw_avx(auVar6,uVar17 & 0xffff,5);
  auVar6 = vpinsrw_avx(auVar6,uVar17 & 0xffff,6);
  auVar6 = vpinsrw_avx(auVar6,uVar17 & 0xffff,7);
  auVar21 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
  uStack_6d0 = auVar21._0_8_;
  uStack_6c8 = auVar21._8_8_;
  local_a88 = 0;
  local_a84 = in_R9D;
  local_8f0 = in_RSI;
  while( true ) {
    if (in_EDI <= local_a88) {
      return;
    }
    iVar18 = (int)local_a84 >> 6;
    if ((int)uVar17 <= iVar18) break;
    auVar21 = vpinsrd_avx(ZEXT416(local_a84),local_a84,1);
    auVar21 = vpinsrd_avx(auVar21,local_a84,2);
    auVar21 = vpinsrd_avx(auVar21,local_a84,3);
    auVar4 = vpinsrd_avx(ZEXT416(local_a84),local_a84,1);
    auVar4 = vpinsrd_avx(auVar4,local_a84,2);
    auVar4 = vpinsrd_avx(auVar4,local_a84,3);
    uStack_550 = auVar4._0_8_;
    uStack_548 = auVar4._8_8_;
    auVar4 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
    auVar4 = vpinsrd_avx(auVar4,0x3f,2);
    auVar4 = vpinsrd_avx(auVar4,0x3f,3);
    auVar23 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
    auVar23 = vpinsrd_avx(auVar23,0x3f,2);
    auVar23 = vpinsrd_avx(auVar23,0x3f,3);
    auVar22 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
    uStack_510 = auVar22._0_8_;
    uStack_508 = auVar22._8_8_;
    auVar8._16_8_ = uStack_550;
    auVar8._0_16_ = auVar21;
    auVar8._24_8_ = uStack_548;
    auVar7._16_8_ = uStack_510;
    auVar7._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar23;
    auVar7._24_8_ = uStack_508;
    auVar7 = vpand_avx2(auVar8,auVar7);
    auVar7 = vpsrld_avx2(auVar7,ZEXT416(1));
    for (local_ba4 = 0; local_ba4 < 0x40; local_ba4 = local_ba4 + 0x10) {
      iVar19 = uVar17 - (iVar18 + local_ba4);
      if (iVar19 < 1) {
        puVar20 = (undefined8 *)((long)local_8f0 + (long)local_ba4 * 2);
        *puVar20 = local_720;
        puVar20[1] = uStack_718;
        puVar20[2] = uStack_710;
        puVar20[3] = uStack_708;
      }
      else {
        auVar8 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                 (in_RCX + (long)iVar18 * 2 + (long)local_ba4 * 2));
        auVar9 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                 (in_RCX + (long)iVar18 * 2 + 2 + (long)local_ba4 * 2));
        auVar9 = vpsubd_avx2(auVar9,auVar8);
        auVar8 = vpslld_avx2(auVar8,ZEXT416(5));
        auVar10._16_8_ = uStack_590;
        auVar10._0_16_ = auVar2;
        auVar10._24_8_ = uStack_588;
        auVar8 = vpaddd_avx2(auVar8,auVar10);
        auVar9 = vpmulld_avx2(auVar9,auVar7);
        auVar8 = vpaddd_avx2(auVar8,auVar9);
        auVar8 = vpsrld_avx2(auVar8,ZEXT416(5));
        auVar8 = vpackusdw_avx2(auVar8,ZEXT1632(auVar8._16_16_));
        local_ae0 = auVar3;
        if (8 < iVar19) {
          auVar9 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                   (in_RCX + (long)iVar18 * 2 + 0x10 + (long)local_ba4 * 2));
          auVar10 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                    (in_RCX + (long)iVar18 * 2 + 0x12 + (long)local_ba4 * 2));
          auVar10 = vpsubd_avx2(auVar10,auVar9);
          auVar9 = vpslld_avx2(auVar9,ZEXT416(5));
          auVar14._16_8_ = uStack_590;
          auVar14._0_16_ = auVar2;
          auVar14._24_8_ = uStack_588;
          auVar9 = vpaddd_avx2(auVar9,auVar14);
          auVar10 = vpmulld_avx2(auVar10,auVar7);
          auVar9 = vpaddd_avx2(auVar9,auVar10);
          auVar9 = vpsrld_avx2(auVar9,ZEXT416(5));
          auVar9 = vpackusdw_avx2(auVar9,ZEXT1632(auVar9._16_16_));
          local_ae0 = auVar9._0_16_;
        }
        auVar23 = ZEXT116(0) * auVar8._16_16_ + ZEXT116(1) * local_ae0;
        sVar11 = (short)iVar18;
        sVar12 = (short)local_ba4;
        auVar21 = vpinsrw_avx(ZEXT216((ushort)(sVar11 + sVar12)),(uint)(ushort)(sVar11 + 1 + sVar12)
                              ,1);
        auVar21 = vpinsrw_avx(auVar21,(uint)(ushort)(sVar11 + 2 + sVar12),2);
        auVar21 = vpinsrw_avx(auVar21,(uint)(ushort)(sVar11 + 3 + sVar12),3);
        auVar21 = vpinsrw_avx(auVar21,(uint)(ushort)(sVar11 + 4 + sVar12),4);
        auVar21 = vpinsrw_avx(auVar21,(uint)(ushort)(sVar11 + 5 + sVar12),5);
        auVar21 = vpinsrw_avx(auVar21,(uint)(ushort)(sVar11 + 6 + sVar12),6);
        auVar21 = vpinsrw_avx(auVar21,(uint)(ushort)(sVar11 + 7 + sVar12),7);
        auVar4 = vpinsrw_avx(ZEXT216((ushort)(sVar11 + 8 + sVar12)),
                             (uint)(ushort)(sVar11 + 9 + sVar12),1);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(sVar11 + 10 + sVar12),2);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(sVar11 + 0xb + sVar12),3);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(sVar11 + 0xc + sVar12),4);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(sVar11 + 0xd + sVar12),5);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(sVar11 + 0xe + sVar12),6);
        auVar4 = vpinsrw_avx(auVar4,(uint)(ushort)(sVar11 + 0xf + sVar12),7);
        uStack_170 = auVar4._0_8_;
        uStack_168 = auVar4._8_8_;
        auVar13._16_8_ = uStack_6d0;
        auVar13._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar6;
        auVar13._24_8_ = uStack_6c8;
        auVar9._16_8_ = uStack_170;
        auVar9._0_16_ = auVar21;
        auVar9._24_8_ = uStack_168;
        auVar9 = vpcmpgtw_avx2(auVar13,auVar9);
        uStack_b10 = auVar23._0_8_;
        uStack_b08 = auVar23._8_8_;
        auVar16._16_8_ = uStack_710;
        auVar16._0_16_ = auVar3;
        auVar16._24_8_ = uStack_708;
        auVar15._16_8_ = uStack_b10;
        auVar15._0_16_ = ZEXT116(0) * local_ae0 + ZEXT116(1) * auVar8._0_16_;
        auVar15._24_8_ = uStack_b08;
        auVar8 = vpblendvb_avx2(auVar16,auVar15,auVar9);
        puVar20 = (undefined8 *)((long)local_8f0 + (long)local_ba4 * 2);
        local_b20 = auVar8._0_8_;
        uStack_b18 = auVar8._8_8_;
        uStack_b10 = auVar8._16_8_;
        uStack_b08 = auVar8._24_8_;
        *puVar20 = local_b20;
        puVar20[1] = uStack_b18;
        puVar20[2] = uStack_b10;
        puVar20[3] = uStack_b08;
      }
    }
    local_a84 = in_R9D + local_a84;
    local_a88 = local_a88 + 1;
    local_8f0 = (undefined8 *)(in_RDX * 2 + (long)local_8f0);
  }
  for (local_b28 = local_a88; local_b28 < in_EDI; local_b28 = local_b28 + 1) {
    *local_8f0 = local_720;
    local_8f0[1] = uStack_718;
    local_8f0[2] = uStack_710;
    local_8f0[3] = uStack_708;
    local_8f0[4] = local_720;
    local_8f0[5] = uStack_718;
    local_8f0[6] = uStack_710;
    local_8f0[7] = uStack_708;
    local_8f0[8] = local_720;
    local_8f0[9] = uStack_718;
    local_8f0[10] = uStack_710;
    local_8f0[0xb] = uStack_708;
    local_8f0[0xc] = local_720;
    local_8f0[0xd] = uStack_718;
    local_8f0[0xe] = uStack_710;
    local_8f0[0xf] = uStack_708;
    local_8f0 = (undefined8 *)(in_RDX * 2 + (long)local_8f0);
  }
  return;
}

Assistant:

static void highbd_dr_prediction_32bit_z1_64xN_avx2(int N, uint16_t *dst,
                                                    ptrdiff_t stride,
                                                    const uint16_t *above,
                                                    int upsample_above,
                                                    int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0, a0_1, a1, a1_1, a32, a16;
  __m256i a_mbase_x, diff, max_base_x256, base_inc256, mask256;

  a16 = _mm256_set1_epi32(16);
  a_mbase_x = _mm256_set1_epi16(above[max_base_x]);
  max_base_x256 = _mm256_set1_epi16(max_base_x);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m256i b, res[2], res1;

    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm256_storeu_si256((__m256i *)dst, a_mbase_x);  // save 32 values
        _mm256_storeu_si256((__m256i *)(dst + 16), a_mbase_x);
        _mm256_storeu_si256((__m256i *)(dst + 32), a_mbase_x);
        _mm256_storeu_si256((__m256i *)(dst + 48), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m256i shift = _mm256_srli_epi32(
        _mm256_and_si256(_mm256_set1_epi32(x), _mm256_set1_epi32(0x3f)), 1);

    __m128i a0_128, a0_1_128, a1_128, a1_1_128;
    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm256_storeu_si256((__m256i *)(dst + j), a_mbase_x);
      } else {
        a0_128 = _mm_loadu_si128((__m128i *)(above + base + j));
        a1_128 = _mm_loadu_si128((__m128i *)(above + base + 1 + j));
        a0 = _mm256_cvtepu16_epi32(a0_128);
        a1 = _mm256_cvtepu16_epi32(a1_128);

        diff = _mm256_sub_epi32(a1, a0);   // a[x+1] - a[x]
        a32 = _mm256_slli_epi32(a0, 5);    // a[x] * 32
        a32 = _mm256_add_epi32(a32, a16);  // a[x] * 32 + 16
        b = _mm256_mullo_epi32(diff, shift);

        res[0] = _mm256_add_epi32(a32, b);
        res[0] = _mm256_srli_epi32(res[0], 5);
        res[0] = _mm256_packus_epi32(
            res[0],
            _mm256_castsi128_si256(_mm256_extracti128_si256(res[0], 1)));
        if (mdif > 8) {
          a0_1_128 = _mm_loadu_si128((__m128i *)(above + base + 8 + j));
          a1_1_128 = _mm_loadu_si128((__m128i *)(above + base + 9 + j));
          a0_1 = _mm256_cvtepu16_epi32(a0_1_128);
          a1_1 = _mm256_cvtepu16_epi32(a1_1_128);

          diff = _mm256_sub_epi32(a1_1, a0_1);  // a[x+1] - a[x]
          a32 = _mm256_slli_epi32(a0_1, 5);     // a[x] * 32
          a32 = _mm256_add_epi32(a32, a16);     // a[x] * 32 + 16
          b = _mm256_mullo_epi32(diff, shift);

          res[1] = _mm256_add_epi32(a32, b);
          res[1] = _mm256_srli_epi32(res[1], 5);
          res[1] = _mm256_packus_epi32(
              res[1],
              _mm256_castsi128_si256(_mm256_extracti128_si256(res[1], 1)));
        } else {
          res[1] = a_mbase_x;
        }
        res1 = _mm256_inserti128_si256(res[0], _mm256_castsi256_si128(res[1]),
                                       1);  // 16 16bit values
        base_inc256 = _mm256_setr_epi16(
            base + j, base + j + 1, base + j + 2, base + j + 3, base + j + 4,
            base + j + 5, base + j + 6, base + j + 7, base + j + 8,
            base + j + 9, base + j + 10, base + j + 11, base + j + 12,
            base + j + 13, base + j + 14, base + j + 15);

        mask256 = _mm256_cmpgt_epi16(max_base_x256, base_inc256);
        res1 = _mm256_blendv_epi8(a_mbase_x, res1, mask256);
        _mm256_storeu_si256((__m256i *)(dst + j), res1);
      }
    }
    x += dx;
  }
}